

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChProximityContainerSPH.cpp
# Opt level: O2

void __thiscall
chrono::ChProximityContainerSPH::AddProximity
          (ChProximityContainerSPH *this,ChCollisionModel *modA,ChCollisionModel *modB)

{
  list<chrono::ChProximitySPH_*,_std::allocator<chrono::ChProximitySPH_*>_> *this_00;
  AddProximityCallback *pAVar1;
  _List_node_base *p_Var2;
  long lVar3;
  ChProximitySPH *this_01;
  bool bVar4;
  ChProximitySPH *mp;
  
  if (modA->mcontactable == (ChContactable *)0x0) {
    bVar4 = false;
  }
  else {
    lVar3 = __dynamic_cast(modA->mcontactable,&ChContactable::typeinfo,&ChNodeSPH::typeinfo,0x50);
    bVar4 = lVar3 != 0;
  }
  if (modB->mcontactable != (ChContactable *)0x0) {
    lVar3 = __dynamic_cast(modB->mcontactable,&ChContactable::typeinfo,&ChNodeSPH::typeinfo,0x50);
    if ((bool)(bVar4 & lVar3 != 0)) {
      pAVar1 = (this->super_ChProximityContainer).add_proximity_callback;
      if (pAVar1 != (AddProximityCallback *)0x0) {
        (**(code **)(*(long *)pAVar1 + 0x10))(pAVar1,modA,modB);
      }
      p_Var2 = (this->lastproximity)._M_node;
      this_00 = &this->proximitylist;
      if (p_Var2 == (_List_node_base *)this_00) {
        this_01 = (ChProximitySPH *)::operator_new(0x18);
        ChProximitySPH::ChProximitySPH(this_01,modA,modB);
        mp = this_01;
        std::__cxx11::list<chrono::ChProximitySPH_*,_std::allocator<chrono::ChProximitySPH_*>_>::
        push_back(this_00,&mp);
        (this->lastproximity)._M_node = (_List_node_base *)this_00;
      }
      else {
        p_Var2 = p_Var2[1]._M_next;
        (*(code *)p_Var2->_M_next[1]._M_next)(p_Var2,modA,modB);
        (this->lastproximity)._M_node = ((this->lastproximity)._M_node)->_M_next;
      }
      this->n_added = this->n_added + 1;
    }
  }
  return;
}

Assistant:

void ChProximityContainerSPH::AddProximity(collision::ChCollisionModel* modA, collision::ChCollisionModel* modB) {
    // Fetch the frames of that proximity and other infos

    ChNodeSPH* mnA = dynamic_cast<ChNodeSPH*>(modA->GetContactable());
    ChNodeSPH* mnB = dynamic_cast<ChNodeSPH*>(modB->GetContactable());

    if (!(mnA && mnB))
        return;

    // Launch the proximity callback, if implemented by the user

    if (this->add_proximity_callback) {
        this->add_proximity_callback->OnAddProximity(*modA, *modB);
    }

    // %%%%%%% Create and add a ChProximitySPH object

    if (lastproximity != proximitylist.end()) {
        // reuse old proximity pairs
        (*lastproximity)->Reset(modA, modB);

        lastproximity++;
    } else {
        // add new proximity
        ChProximitySPH* mp = new ChProximitySPH(modA, modB);

        proximitylist.push_back(mp);
        lastproximity = proximitylist.end();
    }
    n_added++;
}